

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::popSize
          (SimpleParser<avro::parsing::JsonHandler> *this)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  _Elt_pointer pSVar3;
  
  pSVar3 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar3 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar3[-1].kind_ != sSizeCheck) {
    throwMismatch(sSizeCheck,pSVar3[-1].kind_);
  }
  puVar2 = boost::any_cast<unsigned_long_const&>(&pSVar3[-1].extra_);
  uVar1 = *puVar2;
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
            (&(this->parsingStack).c);
  return uVar1;
}

Assistant:

size_t popSize() {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sSizeCheck, s.kind());
        size_t result = s.extra<size_t>();
        parsingStack.pop();
        return result;
    }